

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_t.cpp
# Opt level: O1

void __thiscall deci::stack_t::Print(stack_t *this,ostream *output)

{
  pointer ppvVar1;
  pointer ppvVar2;
  long lVar3;
  ostream oVar4;
  ostream *poVar5;
  value_t *pvVar6;
  long lVar7;
  size_t depth;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  ppvVar1 = (this->storage).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppvVar2 = (this->storage).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  std::__ostream_insert<char,std::char_traits<char>>(output,"result: ",8);
  (*this->result->_vptr_value_t[4])(&local_50);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(output,local_50,local_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (ppvVar2 != ppvVar1) {
    lVar7 = (long)ppvVar2 - (long)ppvVar1 >> 3;
    depth = 0;
    do {
      pvVar6 = Top(this,depth);
      lVar3 = *(long *)output;
      *(uint *)(output + *(long *)(lVar3 + -0x18) + 0x18) =
           *(uint *)(output + *(long *)(lVar3 + -0x18) + 0x18) & 0xffffff4f | 0x80;
      *(uint *)(output + *(long *)(lVar3 + -0x18) + 0x18) =
           *(uint *)(output + *(long *)(lVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar5 = output + *(long *)(lVar3 + -0x18);
      if (output[*(long *)(lVar3 + -0x18) + 0xe1] == (ostream)0x0) {
        oVar4 = (ostream)std::ios::widen((char)poVar5);
        poVar5[0xe0] = oVar4;
        poVar5[0xe1] = (ostream)0x1;
      }
      poVar5[0xe0] = (ostream)0x30;
      *(undefined8 *)(output + *(long *)(*(long *)output + -0x18) + 0x10) = 4;
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)output);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
      (*pvVar6->_vptr_value_t[4])(&local_50,pvVar6);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_50,local_48);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      depth = depth + 1;
    } while (lVar7 + (ulong)(lVar7 == 0) != depth);
  }
  return;
}

Assistant:

void stack_t::Print(std::ostream& output) {
    size_t depth = this->Depth();

    output << "result: " << this->result->ToText() << std::endl;

    for (size_t i = 0; i < depth; ++i) {
      value_t& elem = this->Top(i);
      output << std::right << std::hex << std::setfill('0')
        << std::setw(4) << i << ": "
        << elem.ToText() << std::endl;
    }
  }